

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O3

RawAccessChain
dxil_spv::emit_raw_access_chain
          (Impl *impl,ResourceMeta *meta,CallInst *inst,Type *element_type,uint vecsize)

{
  uint uVar1;
  bool bVar2;
  TypeID TVar3;
  Id component;
  Id pointee;
  Id IVar4;
  int iVar5;
  uint uVar6;
  Id IVar7;
  Builder *this;
  Operation *this_00;
  Value *pVVar8;
  Value *pVVar9;
  uint vecsize_00;
  int iVar10;
  RawAccessChain RVar11;
  Capability local_34;
  
  this = Converter::Impl::builder(impl);
  if ((((impl->execution_mode_meta).native_16bit_operations == false) &&
      ((impl->options).min_precision_prefer_native_16bit == true)) &&
     (bVar2 = type_is_16bit(element_type), bVar2)) {
    TVar3 = LLVMBC::Type::getTypeID(element_type);
    if (TVar3 == HalfTyID) {
      component = spv::Builder::makeFloatType(this,0x20);
    }
    else {
      component = spv::Builder::makeIntegerType(this,0x20,false);
    }
  }
  else {
    component = Converter::Impl::get_type_id(impl,element_type,0);
  }
  pointee = component;
  if (1 < vecsize) {
    pointee = spv::Builder::makeVectorType(this,component,vecsize);
  }
  IVar4 = spv::Builder::makePointer(this,StorageClassStorageBuffer,pointee);
  local_34 = CapabilityRawAccessChainsNV;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&this->capabilities,&local_34);
  spv::Builder::addExtension(this,"SPV_NV_raw_access_chains");
  this_00 = Converter::Impl::allocate(impl,OpRawAccessChainNV,IVar4);
  pVVar8 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
  IVar4 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
  Operation::add_id(this_00,IVar4);
  iVar5 = spv::Builder::getScalarTypeWidth(this,component);
  iVar10 = iVar5 + 7;
  if (-1 < iVar5) {
    iVar10 = iVar5;
  }
  iVar10 = iVar10 >> 3;
  if (meta->kind != RawBuffer) {
    uVar6 = meta->stride;
    IVar4 = spv::Builder::makeIntegerType(this,0x20,false);
    IVar4 = spv::Builder::makeIntConstant(this,IVar4,uVar6,false);
    Operation::add_id(this_00,IVar4);
    pVVar8 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
    IVar4 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
    Operation::add_id(this_00,IVar4);
    pVVar8 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,3);
    IVar4 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
    Operation::add_id(this_00,IVar4);
    Operation::add_literal(this_00,2);
    uVar6 = meta->stride;
    if ((uVar6 & iVar10 * 4 - 1U) == 0) {
      pVVar8 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
      uVar6 = meta->stride;
      pVVar9 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,3);
      vecsize_00 = 4;
      bVar2 = raw_access_structured_can_vectorize(impl,element_type,pVVar8,uVar6,pVVar9,4);
      if (bVar2) goto LAB_00175e3c;
      uVar6 = meta->stride;
    }
    if ((uVar6 & iVar10 * 2 - 1U) == 0) {
      vecsize_00 = 2;
      pVVar8 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
      uVar6 = meta->stride;
      pVVar9 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,3);
      bVar2 = raw_access_structured_can_vectorize(impl,element_type,pVVar8,uVar6,pVVar9,2);
      if (bVar2) goto LAB_00175e3c;
    }
    vecsize_00 = 1;
    goto LAB_00175e3c;
  }
  uVar6 = raw_buffer_data_type_to_addr_shift_log2(impl,element_type);
  pVVar8 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
  vecsize_00 = 4;
  bVar2 = raw_access_byte_address_can_vectorize(impl,element_type,pVVar8,4);
  if (bVar2) {
LAB_00175b70:
    uVar1 = vecsize_00;
    if ((vecsize <= vecsize_00) && (vecsize_00 * iVar10 < 0x11)) {
      pVVar8 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
      IVar4 = build_index_divider(impl,pVVar8,uVar6,vecsize_00);
      IVar7 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar7 = spv::Builder::makeIntConstant(this,IVar7,vecsize_00 * iVar10,false);
      Operation::add_id(this_00,IVar7);
      Operation::add_id(this_00,IVar4);
      IVar4 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar4 = spv::Builder::makeIntConstant(this,IVar4,0,false);
      Operation::add_id(this_00,IVar4);
      Operation::add_literal(this_00,2);
      goto LAB_00175e3c;
    }
  }
  else {
    pVVar8 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
    bVar2 = raw_access_byte_address_can_vectorize(impl,element_type,pVVar8,2);
    vecsize_00 = 2;
    uVar1 = 1;
    if (bVar2) goto LAB_00175b70;
  }
  vecsize_00 = uVar1;
  IVar4 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar4 = spv::Builder::makeIntConstant(this,IVar4,0,false);
  Operation::add_id(this_00,IVar4);
  IVar4 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar4 = spv::Builder::makeIntConstant(this,IVar4,0,false);
  Operation::add_id(this_00,IVar4);
  pVVar8 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
  IVar4 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
  Operation::add_id(this_00,IVar4);
  Operation::add_literal(this_00,1);
LAB_00175e3c:
  IVar4 = this_00->id;
  Converter::Impl::add(impl,this_00,false);
  if (meta->non_uniform == true) {
    spv::Builder::addDecoration(this,this_00->id,DecorationNonUniform,-1);
  }
  if ((meta->physical_pointer_meta).nonwritable == true) {
    spv::Builder::addDecoration(this,this_00->id,DecorationNonWritable,-1);
  }
  if ((meta->physical_pointer_meta).coherent == true) {
    spv::Builder::addDecoration(this,this_00->id,DecorationCoherent,-1);
  }
  RVar11.alignment = vecsize_00 * iVar10;
  RVar11.vector_type_id = pointee;
  RVar11.component_type_id = component;
  RVar11.ptr_id = IVar4;
  return RVar11;
}

Assistant:

static RawAccessChain emit_raw_access_chain(Converter::Impl &impl, const Converter::Impl::ResourceMeta &meta,
                                            const llvm::CallInst *inst, const llvm::Type *element_type, unsigned vecsize)
{
	auto &builder = impl.builder();
	spv::Id raw_component_type_id;
	RawAccessChain raw = {};

	// If we're storing to min16 types and we use native 16-bit in arithmetic,
	// we have to expand to 32-bit before storing :(
	// This will probably fall over with int vs uint, since we don't know how to sign-extend.
	if (!impl.execution_mode_meta.native_16bit_operations &&
	    impl.options.min_precision_prefer_native_16bit &&
	    type_is_16bit(element_type))
	{
		if (element_type->getTypeID() == llvm::Type::TypeID::HalfTyID)
			raw_component_type_id = builder.makeFloatType(32);
		else
			raw_component_type_id = builder.makeUintType(32);
	}
	else
		raw_component_type_id = impl.get_type_id(element_type);

	spv::Id vec_type = vecsize > 1 ? builder.makeVectorType(raw_component_type_id, vecsize) : raw_component_type_id;
	spv::Id ptr_vec_type = builder.makePointer(spv::StorageClassStorageBuffer, vec_type);

	builder.addCapability(spv::CapabilityRawAccessChainsNV);
	builder.addExtension("SPV_NV_raw_access_chains");

	auto *op = impl.allocate(spv::OpRawAccessChainNV, ptr_vec_type);
	op->add_id(impl.get_id_for_value(inst->getOperand(1)));

	unsigned scalar_size = builder.getScalarTypeWidth(raw_component_type_id) / 8;

	if (meta.kind == DXIL::ResourceKind::RawBuffer)
	{
		unsigned addr_shift_log2 = raw_buffer_data_type_to_addr_shift_log2(impl, element_type);

		if (raw_access_byte_address_can_vectorize(impl, element_type, inst->getOperand(2), 4))
			raw.alignment = 4;
		else if (raw_access_byte_address_can_vectorize(impl, element_type, inst->getOperand(2), 2))
			raw.alignment = 2;
		else
			raw.alignment = 1;

		if (raw.alignment != 1 && raw.alignment * scalar_size <= 16 && vecsize <= raw.alignment)
		{
			// If we can prove vectorization, we can treat this as a structured buffer instead.
			// That way we needlessly avoid per-component robustness.
			// BAB descriptor range is aligned to 16 bytes, so we cannot use PerElementMask if the load
			// can straddle a 16 byte boundary.
			// If we care enough, we can split this load into two, and use per-element on both, but that's overkill.

			spv::Id element_id = build_index_divider(impl, inst->getOperand(2), addr_shift_log2, raw.alignment);
			op->add_id(builder.makeUintConstant(raw.alignment * scalar_size));
			op->add_id(element_id);
			op->add_id(builder.makeUintConstant(0));
			op->add_literal(spv::RawAccessChainOperandsRobustnessPerElementNVMask);
		}
		else
		{
			op->add_id(builder.makeUintConstant(0));
			op->add_id(builder.makeUintConstant(0));
			op->add_id(impl.get_id_for_value(inst->getOperand(2)));
			op->add_literal(spv::RawAccessChainOperandsRobustnessPerComponentNVMask);
		}
	}
	else
	{
		op->add_id(builder.makeUintConstant(meta.stride));
		op->add_id(impl.get_id_for_value(inst->getOperand(2)));
		op->add_id(impl.get_id_for_value(inst->getOperand(3)));
		op->add_literal(spv::RawAccessChainOperandsRobustnessPerElementNVMask);

		// Need extra check for stride alignment since we can normally "vectorize" vec3 structured buffers
		// if SSBO alignment is 4. However, we also need to make sure the alignment is correct before accepting.
		if ((meta.stride & (scalar_size * 4 - 1)) == 0 &&
		    raw_access_structured_can_vectorize(
			    impl, element_type,
			    inst->getOperand(2), meta.stride, inst->getOperand(3), 4))
		{
			raw.alignment = 4;
		}
		else if ((meta.stride & (scalar_size * 2 - 1)) == 0 &&
		         raw_access_structured_can_vectorize(
			         impl, element_type,
			         inst->getOperand(2), meta.stride,
			         inst->getOperand(3), 2))
		{
			raw.alignment = 2;
		}
		else
			raw.alignment = 1;
	}

	raw.alignment *= scalar_size;
	raw.component_type_id = raw_component_type_id;
	raw.vector_type_id = vec_type;
	raw.ptr_id = op->id;

	impl.add(op);

	if (meta.non_uniform)
		builder.addDecoration(op->id, spv::DecorationNonUniform);

	if (meta.physical_pointer_meta.nonwritable)
		builder.addDecoration(op->id, spv::DecorationNonWritable);
	if (meta.physical_pointer_meta.coherent)
		builder.addDecoration(op->id, spv::DecorationCoherent);

	return raw;
}